

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# torrent.cpp
# Opt level: O2

void __thiscall
libtorrent::aux::torrent::predicted_have_piece
          (torrent *this,piece_index_t index,time_duration duration)

{
  pointer pppVar1;
  peer_connection *this_00;
  __normal_iterator<libtorrent::aux::strong_typedef<int,_libtorrent::aux::piece_index_tag,_void>_*,_std::vector<libtorrent::aux::strong_typedef<int,_libtorrent::aux::piece_index_tag,_void>,_std::allocator<libtorrent::aux::strong_typedef<int,_libtorrent::aux::piece_index_tag,_void>_>_>_>
  __position;
  pointer pppVar2;
  piece_index_t index_local;
  
  index_local = index;
  __position = ::std::
               __lower_bound<__gnu_cxx::__normal_iterator<libtorrent::aux::strong_typedef<int,libtorrent::aux::piece_index_tag,void>*,std::vector<libtorrent::aux::strong_typedef<int,libtorrent::aux::piece_index_tag,void>,std::allocator<libtorrent::aux::strong_typedef<int,libtorrent::aux::piece_index_tag,void>>>>,libtorrent::aux::strong_typedef<int,libtorrent::aux::piece_index_tag,void>,__gnu_cxx::__ops::_Iter_less_val>
                         ((this->m_predictive_pieces).
                          super__Vector_base<libtorrent::aux::strong_typedef<int,_libtorrent::aux::piece_index_tag,_void>,_std::allocator<libtorrent::aux::strong_typedef<int,_libtorrent::aux::piece_index_tag,_void>_>_>
                          ._M_impl.super__Vector_impl_data._M_start,
                          (this->m_predictive_pieces).
                          super__Vector_base<libtorrent::aux::strong_typedef<int,_libtorrent::aux::piece_index_tag,_void>,_std::allocator<libtorrent::aux::strong_typedef<int,_libtorrent::aux::piece_index_tag,_void>_>_>
                          ._M_impl.super__Vector_impl_data._M_finish);
  if ((__position._M_current ==
       (this->m_predictive_pieces).
       super__Vector_base<libtorrent::aux::strong_typedef<int,_libtorrent::aux::piece_index_tag,_void>,_std::allocator<libtorrent::aux::strong_typedef<int,_libtorrent::aux::piece_index_tag,_void>_>_>
       ._M_impl.super__Vector_impl_data._M_finish) ||
     ((__position._M_current)->m_val != index_local.m_val)) {
    pppVar1 = (this->super_torrent_hot_members).m_connections.
              super_vector<libtorrent::aux::peer_connection_*,_std::allocator<libtorrent::aux::peer_connection_*>_>
              .
              super__Vector_base<libtorrent::aux::peer_connection_*,_std::allocator<libtorrent::aux::peer_connection_*>_>
              ._M_impl.super__Vector_impl_data._M_finish;
    for (pppVar2 = (this->super_torrent_hot_members).m_connections.
                   super_vector<libtorrent::aux::peer_connection_*,_std::allocator<libtorrent::aux::peer_connection_*>_>
                   .
                   super__Vector_base<libtorrent::aux::peer_connection_*,_std::allocator<libtorrent::aux::peer_connection_*>_>
                   ._M_impl.super__Vector_impl_data._M_start; pppVar2 != pppVar1;
        pppVar2 = pppVar2 + 1) {
      this_00 = *pppVar2;
      peer_connection::peer_log
                (this_00,outgoing,"PREDICTIVE_HAVE","piece: %d expected in %d ms",
                 (ulong)(uint)index_local.m_val,duration.__r / 1000000 & 0xffffffff);
      peer_connection::announce_piece(this_00,index_local);
    }
    ::std::
    vector<libtorrent::aux::strong_typedef<int,_libtorrent::aux::piece_index_tag,_void>,_std::allocator<libtorrent::aux::strong_typedef<int,_libtorrent::aux::piece_index_tag,_void>_>_>
    ::insert(&this->m_predictive_pieces,(const_iterator)__position._M_current,&index_local);
  }
  return;
}

Assistant:

void torrent::predicted_have_piece(piece_index_t const index, time_duration const duration)
	{
		auto const i = std::lower_bound(m_predictive_pieces.begin()
			, m_predictive_pieces.end(), index);
		if (i != m_predictive_pieces.end() && *i == index) return;

		for (auto* p : m_connections)
		{
			TORRENT_INCREMENT(m_iterating_connections);
#ifndef TORRENT_DISABLE_LOGGING
			p->peer_log(peer_log_alert::outgoing, "PREDICTIVE_HAVE", "piece: %d expected in %d ms"
				, static_cast<int>(index), static_cast<int>(total_milliseconds(duration)));
#else
			TORRENT_UNUSED(duration);
#endif
			p->announce_piece(index);
		}

		m_predictive_pieces.insert(i, index);
	}